

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

void __thiscall Reader::processbinsec(Reader *this)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *this_00;
  pointer pPVar3;
  element_type *peVar4;
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *in_RDI;
  shared_ptr<Variable> var;
  string *in_stack_00000030;
  Builder *in_stack_00000038;
  string name;
  iterator *end;
  iterator *begin;
  LpSectionKeyword this_section_keyword;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  *in_stack_ffffffffffffff78;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  *in_stack_ffffffffffffff80;
  key_type *in_stack_ffffffffffffff88;
  allocator *paVar5;
  key_type *in_stack_ffffffffffffffb8;
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  
  sVar2 = std::
          map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
          ::count(in_RDI,in_stack_ffffffffffffff88);
  if (sVar2 != 0) {
    this_00 = std::
              map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
              ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::
    map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
    ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    while (bVar1 = __gnu_cxx::operator!=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78), bVar1
          ) {
      pPVar3 = __gnu_cxx::
               __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
               ::operator->(&this_00->first);
      if (pPVar3->type == SECID) {
        __gnu_cxx::
        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
        ::operator->(&this_00->first);
        lpassert(SUB81((ulong)in_RDI >> 0x38,0));
      }
      else {
        __gnu_cxx::
        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
        ::operator->(&this_00->first);
        lpassert(SUB81((ulong)in_RDI >> 0x38,0));
        pPVar3 = __gnu_cxx::
                 __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                 ::operator->(&this_00->first);
        in_stack_ffffffffffffff80 =
             (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
              *)(pPVar3->field_1).name;
        paVar5 = (allocator *)&stack0xffffffffffffffbf;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffffc0,(char *)in_stack_ffffffffffffff80,paVar5);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
        Builder::getvarbyname(in_stack_00000038,in_stack_00000030);
        peVar4 = std::__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x41fc25);
        peVar4->type = BINARY;
        peVar4 = std::__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x41fc35);
        if ((peVar4->upperbound == INFINITY) && (!NAN(peVar4->upperbound))) {
          peVar4 = std::__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x41fc54);
          peVar4->upperbound = 1.0;
        }
        std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41fca1);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
      }
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator++(&this_00->first);
    }
  }
  return;
}

Assistant:

void Reader::processbinsec() {
  const LpSectionKeyword this_section_keyword = LpSectionKeyword::BIN;
  if (!sectiontokens.count(this_section_keyword)) return;
  std::vector<ProcessedToken>::iterator& begin(
      sectiontokens[this_section_keyword].first);
  std::vector<ProcessedToken>::iterator& end(
      sectiontokens[this_section_keyword].second);
  for (; begin != end; ++begin) {
    if (begin->type == ProcessedTokenType::SECID) {
      // Possible to have repeat of keyword for this section type
      lpassert(begin->keyword == this_section_keyword);
      continue;
    }
    lpassert(begin->type == ProcessedTokenType::VARID);
    std::string name = begin->name;
    std::shared_ptr<Variable> var = builder.getvarbyname(name);
    var->type = VariableType::BINARY;
    // Respect any bounds already declared
    if (var->upperbound == kHighsInf) var->upperbound = 1.0;
  }
}